

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_stream_and_dir.hpp
# Opt level: O2

int32_t __thiscall
CompoundFile::Stream::whereIsShortSector(Stream *this,SecID *shortSector,SecID *largeSector)

{
  int iVar1;
  reference pvVar2;
  int iVar3;
  
  iVar3 = this->m_header->m_sectorSize / this->m_header->m_shortSectorSize;
  iVar1 = shortSector->m_id;
  pvVar2 = std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
                     (&this->m_largeStreamChain,(long)(iVar1 / iVar3));
  largeSector->m_id = pvVar2->m_id;
  return iVar1 % iVar3;
}

Assistant:

inline int32_t
Stream::whereIsShortSector( const SecID & shortSector,
	SecID & largeSector )
{
	const int32_t shortSectorsInLarge =
		m_header.sectorSize() / m_header.shortSectorSize();

	const int32_t offset = shortSector % shortSectorsInLarge;

	const int32_t largeSectorIdx = shortSector / shortSectorsInLarge;

	largeSector = m_largeStreamChain.at( largeSectorIdx );

	return offset;
}